

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::unpack_bc4(void *pBlock_bits,uint8_t *pPixels,uint32_t stride)

{
  uint32_t uVar1;
  uint64_t selector_bits_00;
  uint in_EDX;
  undefined1 *in_RSI;
  bc4_block *in_RDI;
  uint32_t y;
  uint64_t selector_bits;
  uint8_t sel_values [8];
  bc4_block *pBlock;
  uint8_t *in_stack_ffffffffffffffb8;
  uint local_34;
  undefined1 local_28 [8];
  bc4_block *local_20;
  uint local_14;
  undefined1 *local_10;
  
  local_20 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  bc4_block::get_low_alpha(in_RDI);
  bc4_block::get_high_alpha(local_20);
  bc4_block::get_block_values(in_stack_ffffffffffffffb8,0,0x13663e);
  selector_bits_00 = bc4_block::get_selector_bits(local_20);
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    uVar1 = bc4_block::get_selector(local_20,0,local_34,selector_bits_00);
    *local_10 = local_28[uVar1];
    uVar1 = bc4_block::get_selector(local_20,1,local_34,selector_bits_00);
    local_10[local_14] = local_28[uVar1];
    uVar1 = bc4_block::get_selector(local_20,2,local_34,selector_bits_00);
    local_10[local_14 << 1] = local_28[uVar1];
    uVar1 = bc4_block::get_selector(local_20,3,local_34,selector_bits_00);
    local_10[local_14 * 3] = local_28[uVar1];
    local_10 = local_10 + (local_14 << 2);
  }
  return;
}

Assistant:

void unpack_bc4(const void* pBlock_bits, uint8_t* pPixels, uint32_t stride)
	{
		static_assert(sizeof(bc4_block) == 8, "sizeof(bc4_block) == 8");

		const bc4_block* pBlock = static_cast<const bc4_block*>(pBlock_bits);

		uint8_t sel_values[8];
		bc4_block::get_block_values(sel_values, pBlock->get_low_alpha(), pBlock->get_high_alpha());

		const uint64_t selector_bits = pBlock->get_selector_bits();

		for (uint32_t y = 0; y < 4; y++, pPixels += (stride * 4U))
		{
			pPixels[0] = sel_values[pBlock->get_selector(0, y, selector_bits)];
			pPixels[stride * 1] = sel_values[pBlock->get_selector(1, y, selector_bits)];
			pPixels[stride * 2] = sel_values[pBlock->get_selector(2, y, selector_bits)];
			pPixels[stride * 3] = sel_values[pBlock->get_selector(3, y, selector_bits)];
		}
	}